

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

nn_list_item * nn_list_erase(nn_list *self,nn_list_item *item)

{
  nn_list_item *pnVar1;
  int iVar2;
  nn_list_item *next;
  nn_list_item *item_local;
  nn_list *self_local;
  
  iVar2 = nn_list_item_isinlist(item);
  if (iVar2 == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_item_isinlist (item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/list.c"
            ,0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  if (item->prev == (nn_list_item *)0x0) {
    self->first = item->next;
  }
  else {
    item->prev->next = item->next;
  }
  if (item->next == (nn_list_item *)0x0) {
    self->last = item->prev;
  }
  else {
    item->next->prev = item->prev;
  }
  pnVar1 = item->next;
  item->prev = (nn_list_item *)0xffffffffffffffff;
  item->next = (nn_list_item *)0xffffffffffffffff;
  return pnVar1;
}

Assistant:

struct nn_list_item *nn_list_erase (struct nn_list *self,
    struct nn_list_item *item)
{
    struct nn_list_item *next;

    nn_assert (nn_list_item_isinlist (item));

    if (item->prev)
        item->prev->next = item->next;
    else
        self->first = item->next;
    if (item->next)
        item->next->prev = item->prev;
    else
        self->last = item->prev;

    next = item->next;

    item->prev = NN_LIST_NOTINLIST;
    item->next = NN_LIST_NOTINLIST;

    return next;
}